

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

void __thiscall QPDFLogger::setInfo(QPDFLogger *this,shared_ptr<Pipeline> *p)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  shared_ptr<Pipeline> *p_local;
  QPDFLogger *this_local;
  
  bVar1 = std::operator==(p,(nullptr_t)0x0);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    bVar1 = std::operator==(&peVar3->p_save,&peVar2->p_stdout);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      std::shared_ptr<Pipeline>::operator=(p,&peVar3->p_stderr);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      std::shared_ptr<Pipeline>::operator=(p,&peVar3->p_stdout);
    }
  }
  peVar3 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<Pipeline>::operator=(&peVar3->p_info,p);
  return;
}

Assistant:

void
QPDFLogger::setInfo(std::shared_ptr<Pipeline> p)
{
    if (p == nullptr) {
        if (m->p_save == m->p_stdout) {
            p = m->p_stderr;
        } else {
            p = m->p_stdout;
        }
    }
    m->p_info = p;
}